

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void empty_readdir_cb(uv_fs_t *req)

{
  void *dir_00;
  int iVar1;
  uv_loop_t *loop;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int r;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  dir_00 = readdir_req.ptr;
  if (req != &readdir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x3d,"req","==","&readdir_req",req,"==",&readdir_req);
    abort();
  }
  if ((long)readdir_req.fs_type != 0x20) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x3e,"req->fs_type","==","UV_FS_READDIR",(long)readdir_req.fs_type,"==",0x20);
    abort();
  }
  if (readdir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x3f,"req->result","==","0",readdir_req.result,"==",0);
    abort();
  }
  uv_fs_req_cleanup(&readdir_req);
  loop = uv_default_loop();
  iVar1 = uv_fs_closedir(loop,&closedir_req,(uv_dir_t *)dir_00,empty_closedir_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x46,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &readdir_req);
  ASSERT_EQ(req->fs_type, UV_FS_READDIR);
  ASSERT_OK(req->result);
  dir = req->ptr;
  uv_fs_req_cleanup(req);
  r = uv_fs_closedir(uv_default_loop(),
                     &closedir_req,
                     dir,
                     empty_closedir_cb);
  ASSERT_OK(r);
}